

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O2

int drop_throw(monst *magr,obj *obj,obj *ostack,boolean thrown,boolean ohit,int x,int y)

{
  short sVar1;
  bool bVar2;
  boolean bVar3;
  schar sVar4;
  uint uVar5;
  trap *ptVar6;
  int iVar7;
  obj *olaunch;
  obj *in_stack_ffffffffffffffa8;
  monst *local_48;
  
  if (magr == (monst *)0x0) {
    olaunch = (obj *)0x0;
  }
  else {
    olaunch = magr->mw;
  }
  sVar1 = obj->otyp;
  if ((((long)sVar1 == 0x120) || (obj->oclass == '\x11')) || (ohit != '\0' && sVar1 == 0x10f))
  goto LAB_001e8797;
  if (ohit != '\0') {
    if (obj->oclass == '\x02') {
      if ((sVar1 == 0x213) || ((byte)(objects[sVar1].oc_subtyp + 0x1aU) < 5)) {
LAB_001e87fe:
        uVar5 = mt_random();
        if (uVar5 % 3 != 0) goto LAB_001e8797;
      }
    }
    else if (sVar1 == 0x213) goto LAB_001e87fe;
  }
  local_48 = level->monsters[x][y];
  if ((local_48 == (monst *)0x0) || ((*(uint *)&local_48->field_0x60 >> 9 & 1) != 0)) {
    bVar2 = true;
    local_48 = (monst *)0x0;
  }
  else {
    if ((*(uint *)&local_48->field_0x60 >> 0x17 & 1) != 0) {
      ptVar6 = t_at(level,x,y);
      if (ptVar6 == (trap *)0x0) {
        bVar2 = false;
        goto LAB_001e8893;
      }
      if ((byte)((ptVar6->field_0x8 & 0x1f) - 0xb) < 2) {
LAB_001e8797:
        bVar3 = detonate_obj(obj,ostack,olaunch,x,y,thrown);
        if (bVar3 != '\0') {
          return 1;
        }
        obfree(obj,(obj *)0x0);
        return 1;
      }
    }
    bVar2 = false;
  }
LAB_001e8893:
  sVar4 = down_gate((xchar)x,(xchar)y);
  iVar7 = 1;
  if ((((sVar4 == -1) || (bVar3 = ship_object(obj,(xchar)x,(xchar)y,'\0'), bVar3 == '\0')) &&
      (bVar3 = flooreffects(obj,x,y,"fall"), bVar3 == '\0')) &&
     (bVar3 = detonate_obj(obj,ostack,olaunch,x,y,thrown), bVar3 == '\0')) {
    place_object(obj,level,x,y);
    if (bVar2) {
      if (u.uy == y && u.ux == x) {
        local_48 = &youmonst;
      }
      else {
        local_48 = (monst *)0x0;
      }
    }
    if ((ohit != '\0') && (local_48 != (monst *)0x0)) {
      passive_obj(local_48,obj,(attack *)0x0);
    }
    stackobj(in_stack_ffffffffffffffa8);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int drop_throw(struct monst *magr, struct obj *obj, struct obj *ostack,
		      boolean thrown, boolean ohit, int x, int y)
{
	int retvalu = 1;
	int create;
	struct monst *mtmp;
	struct trap *t;
	struct obj *monwep = (magr ? MON_WEP(magr) : NULL);

	if (obj->otyp == CREAM_PIE || obj->oclass == VENOM_CLASS ||
		    (ohit && obj->otyp == EGG))
		create = 0;
	else if (ohit && (is_multigen(obj) || obj->otyp == ROCK))
		create = !rn2(3);
	else create = 1;

	if (create && !((mtmp = m_at(level, x, y)) && (mtmp->mtrapped) &&
			(t = t_at(level, x, y)) && ((t->ttyp == PIT) ||
			(t->ttyp == SPIKED_PIT)))) {
		int objgone = 0;

		if (down_gate(x, y) != -1)
			objgone = ship_object(obj, x, y, FALSE);
		if (!objgone) {
			if (!flooreffects(obj,x,y,"fall")) { /* don't double-dip on damage */
			    if (detonate_obj(obj, ostack, monwep, x, y, thrown))
				return 1;
			    place_object(obj, level, x, y);
			    if (!mtmp && x == u.ux && y == u.uy)
				mtmp = &youmonst;
			    if (mtmp && ohit)
				passive_obj(mtmp, obj, NULL);
			    stackobj(obj);
			    retvalu = 0;
			}
		}
	} else {
	    if (detonate_obj(obj, ostack, monwep, x, y, thrown))
		return 1;
	    obfree(obj, NULL);
	}

	return retvalu;
}